

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

int mbedtls_internal_aes_encrypt(mbedtls_aes_context *ctx,uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  uint *puVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  
  puVar13 = ctx->rk;
  uVar15 = *puVar13 ^ *(uint *)input;
  uVar20 = puVar13[1] ^ *(uint *)(input + 4);
  uVar21 = puVar13[2] ^ *(uint *)(input + 8);
  puVar14 = puVar13 + 4;
  uVar16 = puVar13[3] ^ *(uint *)(input + 0xc);
  iVar17 = ctx->nr >> 1;
  if (1 < iVar17) {
    uVar18 = iVar17 + 1;
    do {
      uVar22 = FT0[uVar15 & 0xff] ^ *puVar14 ^ FT1[uVar20 >> 8 & 0xff] ^
               *(uint *)((long)FT2 + (ulong)(uVar21 >> 0xe & 0x3fc)) ^ FT3[uVar16 >> 0x18];
      uVar23 = FT0[uVar20 & 0xff] ^ puVar14[1] ^ FT1[uVar21 >> 8 & 0xff] ^
               *(uint *)((long)FT2 + (ulong)(uVar16 >> 0xe & 0x3fc)) ^ FT3[uVar15 >> 0x18];
      uVar19 = FT0[uVar21 & 0xff] ^ puVar14[2] ^ FT1[uVar16 >> 8 & 0xff] ^
               *(uint *)((long)FT2 + (ulong)(uVar15 >> 0xe & 0x3fc)) ^ FT3[uVar20 >> 0x18];
      uVar16 = FT0[uVar16 & 0xff] ^ puVar14[3] ^ FT1[uVar15 >> 8 & 0xff] ^
               *(uint *)((long)FT2 + (ulong)(uVar20 >> 0xe & 0x3fc)) ^ FT3[uVar21 >> 0x18];
      uVar15 = FT0[uVar22 & 0xff] ^ puVar14[4] ^ FT1[uVar23 >> 8 & 0xff] ^
               *(uint *)((long)FT2 + (ulong)(uVar19 >> 0xe & 0x3fc)) ^ FT3[uVar16 >> 0x18];
      uVar20 = FT0[uVar23 & 0xff] ^ puVar14[5] ^ FT1[uVar19 >> 8 & 0xff] ^
               *(uint *)((long)FT2 + (ulong)(uVar16 >> 0xe & 0x3fc)) ^ FT3[uVar22 >> 0x18];
      uVar21 = FT0[uVar19 & 0xff] ^ puVar14[6] ^ FT1[uVar16 >> 8 & 0xff] ^
               *(uint *)((long)FT2 + (ulong)(uVar22 >> 0xe & 0x3fc)) ^ FT3[uVar23 >> 0x18];
      uVar16 = FT0[uVar16 & 0xff] ^ puVar14[7] ^ FT1[uVar22 >> 8 & 0xff] ^
               *(uint *)((long)FT2 + (ulong)(uVar23 >> 0xe & 0x3fc)) ^ FT3[uVar19 >> 0x18];
      puVar14 = puVar14 + 8;
      uVar18 = uVar18 - 1;
    } while (2 < uVar18);
  }
  uVar22 = FT0[uVar15 & 0xff] ^ *puVar14 ^ FT1[uVar20 >> 8 & 0xff] ^
           *(uint *)((long)FT2 + (ulong)(uVar21 >> 0xe & 0x3fc)) ^ FT3[uVar16 >> 0x18];
  uVar19 = FT0[uVar20 & 0xff] ^ puVar14[1] ^ FT1[uVar21 >> 8 & 0xff] ^
           *(uint *)((long)FT2 + (ulong)(uVar16 >> 0xe & 0x3fc)) ^ FT3[uVar15 >> 0x18];
  uVar23 = FT0[uVar21 & 0xff] ^ puVar14[2] ^ FT1[uVar16 >> 8 & 0xff] ^
           *(uint *)((long)FT2 + (ulong)(uVar15 >> 0xe & 0x3fc)) ^ FT3[uVar20 >> 0x18];
  uVar18 = FT0[uVar16 & 0xff] ^ puVar14[3] ^ FT1[uVar15 >> 8 & 0xff] ^
           *(uint *)((long)FT2 + (ulong)(uVar20 >> 0xe & 0x3fc)) ^ FT3[uVar21 >> 0x18];
  bVar1 = FSb[uVar19 & 0xff];
  uVar15 = puVar14[5];
  bVar2 = FSb[uVar23 & 0xff];
  uVar16 = puVar14[6];
  bVar3 = FSb[uVar18 & 0xff];
  uVar20 = puVar14[7];
  uVar21 = ((uint)FSb[uVar18 >> 0x18] << 0x18 |
           (uint)FSb[uVar23 >> 0x10 & 0xff] << 0x10 | (uint)FSb[uVar19 >> 8 & 0xff] << 8) ^
           (uint)FSb[uVar22 & 0xff] ^ puVar14[4];
  bVar4 = FSb[uVar23 >> 8 & 0xff];
  bVar5 = FSb[uVar18 >> 0x10 & 0xff];
  bVar6 = FSb[uVar22 >> 0x18];
  bVar7 = FSb[uVar18 >> 8 & 0xff];
  bVar8 = FSb[uVar22 >> 0x10 & 0xff];
  bVar9 = FSb[uVar19 >> 0x18];
  bVar10 = FSb[uVar22 >> 8 & 0xff];
  bVar11 = FSb[uVar19 >> 0x10 & 0xff];
  bVar12 = FSb[uVar23 >> 0x18];
  *output = (uchar)((uint)FSb[uVar22 & 0xff] ^ puVar14[4]);
  output[1] = (uchar)(uVar21 >> 8);
  output[2] = (uchar)(uVar21 >> 0x10);
  output[3] = (uchar)(uVar21 >> 0x18);
  uVar21 = ((uint)bVar6 << 0x18 | (uint)bVar5 << 0x10 | (uint)bVar4 << 8) ^ bVar1 ^ uVar15;
  output[4] = (uchar)(bVar1 ^ uVar15);
  output[5] = (uchar)(uVar21 >> 8);
  output[6] = (uchar)(uVar21 >> 0x10);
  output[7] = (uchar)(uVar21 >> 0x18);
  uVar15 = ((uint)bVar9 << 0x18 | (uint)bVar8 << 0x10 | (uint)bVar7 << 8) ^ bVar2 ^ uVar16;
  output[8] = (uchar)(bVar2 ^ uVar16);
  output[9] = (uchar)(uVar15 >> 8);
  output[10] = (uchar)(uVar15 >> 0x10);
  output[0xb] = (uchar)(uVar15 >> 0x18);
  uVar15 = ((uint)bVar12 << 0x18 | (uint)bVar11 << 0x10 | (uint)bVar10 << 8) ^ bVar3 ^ uVar20;
  output[0xc] = (uchar)(bVar3 ^ uVar20);
  output[0xd] = (uchar)(uVar15 >> 8);
  output[0xe] = (uchar)(uVar15 >> 0x10);
  output[0xf] = (uchar)(uVar15 >> 0x18);
  return 0;
}

Assistant:

int mbedtls_internal_aes_encrypt( mbedtls_aes_context *ctx,
                                  const unsigned char input[16],
                                  unsigned char output[16] )
{
    int i;
    uint32_t *RK, X0, X1, X2, X3, Y0, Y1, Y2, Y3;

    RK = ctx->rk;

    GET_UINT32_LE( X0, input,  0 ); X0 ^= *RK++;
    GET_UINT32_LE( X1, input,  4 ); X1 ^= *RK++;
    GET_UINT32_LE( X2, input,  8 ); X2 ^= *RK++;
    GET_UINT32_LE( X3, input, 12 ); X3 ^= *RK++;

    for( i = ( ctx->nr >> 1 ) - 1; i > 0; i-- )
    {
        AES_FROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );
        AES_FROUND( X0, X1, X2, X3, Y0, Y1, Y2, Y3 );
    }

    AES_FROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );

    X0 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y0       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y1 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y2 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y3 >> 24 ) & 0xFF ] << 24 );

    X1 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y1       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y2 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y3 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y0 >> 24 ) & 0xFF ] << 24 );

    X2 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y2       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y3 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y0 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y1 >> 24 ) & 0xFF ] << 24 );

    X3 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y3       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y0 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y1 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y2 >> 24 ) & 0xFF ] << 24 );

    PUT_UINT32_LE( X0, output,  0 );
    PUT_UINT32_LE( X1, output,  4 );
    PUT_UINT32_LE( X2, output,  8 );
    PUT_UINT32_LE( X3, output, 12 );

    return( 0 );
}